

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_set_forward_list_Test::TestBody(ObjectTest_basic_set_forward_list_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_750 [8];
  Message local_748 [8];
  _Fwd_list_impl local_740;
  _Fwd_list_impl local_738;
  undefined1 local_730 [8];
  undefined1 local_728 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_6f8 [8];
  Message local_6f0 [15];
  bool local_6e1;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_6c8 [8];
  Message local_6c0 [8];
  _Fwd_list_impl local_6b8;
  _Fwd_list_impl local_6b0;
  undefined1 local_6a8 [8];
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_670 [8];
  Message local_668 [15];
  bool local_659;
  undefined1 local_658 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_640 [8];
  Message local_638 [8];
  _Fwd_list_impl local_630;
  _Fwd_list_impl local_628;
  undefined1 local_620 [8];
  undefined1 local_618 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_5e8 [8];
  Message local_5e0 [15];
  bool local_5d1;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_5b8 [8];
  Message local_5b0 [8];
  _Fwd_list_impl local_5a8;
  _Fwd_list_impl local_5a0;
  undefined1 local_598 [8];
  undefined1 local_590 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_560 [8];
  Message local_558 [15];
  bool local_549;
  undefined1 local_548 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_530 [8];
  Message local_528 [8];
  _Fwd_list_impl local_520;
  _Fwd_list_impl local_518;
  undefined1 local_510 [8];
  undefined1 local_508 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_4d8 [8];
  Message local_4d0 [15];
  bool local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_4a8 [8];
  Message local_4a0 [8];
  _Fwd_list_impl local_498;
  _Fwd_list_impl local_490;
  undefined1 local_488 [8];
  undefined1 local_480 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_450 [8];
  Message local_448 [15];
  bool local_439;
  undefined1 local_438 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_420 [8];
  Message local_418 [8];
  _Fwd_list_impl local_410;
  _Fwd_list_impl local_408;
  undefined1 local_400 [8];
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_3c8 [8];
  Message local_3c0 [15];
  bool local_3b1;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_398 [8];
  Message local_390 [8];
  _Fwd_list_impl local_388;
  _Fwd_list_impl local_380;
  undefined1 local_378 [8];
  undefined1 local_370 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_340 [8];
  Message local_338 [15];
  bool local_329;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_310 [8];
  Message local_308 [8];
  _Fwd_list_impl local_300;
  _Fwd_list_impl local_2f8;
  undefined1 local_2f0 [8];
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_2b8 [8];
  Message local_2b0 [15];
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_288 [8];
  Message local_280 [8];
  _Fwd_list_impl local_278;
  _Fwd_list_impl local_270;
  undefined1 local_268 [8];
  undefined1 local_260 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_230 [8];
  Message local_228 [15];
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_200 [8];
  Message local_1f8 [8];
  _Fwd_list_impl local_1f0;
  _Fwd_list_impl local_1e8;
  undefined1 local_1e0 [8];
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1a8 [8];
  Message local_1a0 [15];
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_178 [8];
  Message local_170 [8];
  _Fwd_list_impl local_168;
  _Fwd_list_impl local_160;
  undefined1 local_158 [8];
  undefined1 local_150 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_120 [8];
  Message local_118 [15];
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_f0 [8];
  Message local_e8 [8];
  _Fwd_list_impl local_e0;
  _Fwd_list_impl local_d8;
  undefined1 local_d0 [8];
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_98 [8];
  Message local_90 [15];
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  _Fwd_list_impl local_60;
  undefined1 local_58 [8];
  object obj;
  ObjectTest_basic_set_forward_list_Test *this_local;
  
  jessilib::object::object((object *)local_58);
  local_60._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<bool,_std::allocator<bool>_>::forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)&local_60);
  jessilib::object::set<std::forward_list<bool,_std::allocator<bool>_>,_nullptr>
            ((object *)local_58,(forward_list<bool,_std::allocator<bool>_> *)&local_60);
  std::forward_list<bool,_std::allocator<bool>_>::~forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)&local_60);
  local_81 = jessilib::object::has<std::forward_list<bool,std::allocator<bool>>>((object *)local_58)
  ;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_80,
               "obj .has< std::forward_list<bool> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x22e,pcVar2);
    testing::internal::AssertHelper::operator=(local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_d8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<bool,_std::allocator<bool>_>::forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)&local_d8);
  jessilib::object::
  get<std::forward_list<bool,_std::allocator<bool>_>,_std::forward_list<bool,_std::allocator<bool>_>,_nullptr>
            ((object *)local_d0,(forward_list<bool,_std::allocator<bool>_> *)local_58);
  local_e0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<bool,_std::allocator<bool>_>::forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)&local_e0);
  testing::internal::EqHelper::
  Compare<std::forward_list<bool,_std::allocator<bool>_>,_std::forward_list<bool,_std::allocator<bool>_>,_nullptr>
            ((EqHelper *)local_c8,"obj .get< std::forward_list<bool> >()",
             "std::forward_list<bool> {}",(forward_list<bool,_std::allocator<bool>_> *)local_d0,
             (forward_list<bool,_std::allocator<bool>_> *)&local_e0);
  std::forward_list<bool,_std::allocator<bool>_>::~forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)&local_e0);
  std::forward_list<bool,_std::allocator<bool>_>::~forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)local_d0);
  std::forward_list<bool,_std::allocator<bool>_>::~forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x22e,pcVar2);
    testing::internal::AssertHelper::operator=(local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<signed_char,_std::allocator<signed_char>_>::forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)&gtest_ar__1.message_);
  jessilib::object::set<std::forward_list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((object *)local_58,
             (forward_list<signed_char,_std::allocator<signed_char>_> *)&gtest_ar__1.message_);
  std::forward_list<signed_char,_std::allocator<signed_char>_>::~forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)&gtest_ar__1.message_);
  local_109 = jessilib::object::has<std::forward_list<signed_char,std::allocator<signed_char>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_1.message_,local_108,
               "obj .has< std::forward_list<signed char> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x22f,pcVar2);
    testing::internal::AssertHelper::operator=(local_120,local_118);
    testing::internal::AssertHelper::~AssertHelper(local_120);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_160._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<signed_char,_std::allocator<signed_char>_>::forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)&local_160);
  jessilib::object::
  get<std::forward_list<signed_char,_std::allocator<signed_char>_>,_std::forward_list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((object *)local_158,(forward_list<signed_char,_std::allocator<signed_char>_> *)local_58
            );
  local_168._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<signed_char,_std::allocator<signed_char>_>::forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)&local_168);
  testing::internal::EqHelper::
  Compare<std::forward_list<signed_char,_std::allocator<signed_char>_>,_std::forward_list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((EqHelper *)local_150,"obj .get< std::forward_list<signed char> >()",
             "std::forward_list<signed char> {}",
             (forward_list<signed_char,_std::allocator<signed_char>_> *)local_158,
             (forward_list<signed_char,_std::allocator<signed_char>_> *)&local_168);
  std::forward_list<signed_char,_std::allocator<signed_char>_>::~forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)&local_168);
  std::forward_list<signed_char,_std::allocator<signed_char>_>::~forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)local_158);
  std::forward_list<signed_char,_std::allocator<signed_char>_>::~forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x22f,pcVar2);
    testing::internal::AssertHelper::operator=(local_178,local_170);
    testing::internal::AssertHelper::~AssertHelper(local_178);
    testing::Message::~Message(local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
  jessilib::object::set<std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((object *)local_58,
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::~forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
  local_191 = jessilib::object::has<std::forward_list<unsigned_char,std::allocator<unsigned_char>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_190,&local_191,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_2.message_,local_190,
               "obj .has< std::forward_list<unsigned char> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x230,pcVar2);
    testing::internal::AssertHelper::operator=(local_1a8,local_1a0);
    testing::internal::AssertHelper::~AssertHelper(local_1a8);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1e8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8);
  jessilib::object::
  get<std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((object *)local_1e0,
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  local_1f0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1f0);
  testing::internal::EqHelper::
  Compare<std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((EqHelper *)local_1d8,"obj .get< std::forward_list<unsigned char> >()",
             "std::forward_list<unsigned char> {}",
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0,
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1f0);
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::~forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1f0);
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::~forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e0);
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::~forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x230,pcVar2);
    testing::internal::AssertHelper::operator=(local_200,local_1f8);
    testing::internal::AssertHelper::~AssertHelper(local_200);
    testing::Message::~Message(local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<short,_std::allocator<short>_>::forward_list
            ((forward_list<short,_std::allocator<short>_> *)&gtest_ar__3.message_);
  jessilib::object::set<std::forward_list<short,_std::allocator<short>_>,_nullptr>
            ((object *)local_58,(forward_list<short,_std::allocator<short>_> *)&gtest_ar__3.message_
            );
  std::forward_list<short,_std::allocator<short>_>::~forward_list
            ((forward_list<short,_std::allocator<short>_> *)&gtest_ar__3.message_);
  local_219 = jessilib::object::has<std::forward_list<short,std::allocator<short>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_218,&local_219,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_3.message_,local_218,
               "obj .has< std::forward_list<short> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_3.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x231,pcVar2);
    testing::internal::AssertHelper::operator=(local_230,local_228);
    testing::internal::AssertHelper::~AssertHelper(local_230);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  local_270._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<short,_std::allocator<short>_>::forward_list
            ((forward_list<short,_std::allocator<short>_> *)&local_270);
  jessilib::object::
  get<std::forward_list<short,_std::allocator<short>_>,_std::forward_list<short,_std::allocator<short>_>,_nullptr>
            ((object *)local_268,(forward_list<short,_std::allocator<short>_> *)local_58);
  local_278._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<short,_std::allocator<short>_>::forward_list
            ((forward_list<short,_std::allocator<short>_> *)&local_278);
  testing::internal::EqHelper::
  Compare<std::forward_list<short,_std::allocator<short>_>,_std::forward_list<short,_std::allocator<short>_>,_nullptr>
            ((EqHelper *)local_260,"obj .get< std::forward_list<short> >()",
             "std::forward_list<short> {}",(forward_list<short,_std::allocator<short>_> *)local_268,
             (forward_list<short,_std::allocator<short>_> *)&local_278);
  std::forward_list<short,_std::allocator<short>_>::~forward_list
            ((forward_list<short,_std::allocator<short>_> *)&local_278);
  std::forward_list<short,_std::allocator<short>_>::~forward_list
            ((forward_list<short,_std::allocator<short>_> *)local_268);
  std::forward_list<short,_std::allocator<short>_>::~forward_list
            ((forward_list<short,_std::allocator<short>_> *)&local_270);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(local_280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              (local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x231,pcVar2);
    testing::internal::AssertHelper::operator=(local_288,local_280);
    testing::internal::AssertHelper::~AssertHelper(local_288);
    testing::Message::~Message(local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<int,_std::allocator<int>_>::forward_list
            ((forward_list<int,_std::allocator<int>_> *)&gtest_ar__4.message_);
  jessilib::object::set<std::forward_list<int,_std::allocator<int>_>,_nullptr>
            ((object *)local_58,(forward_list<int,_std::allocator<int>_> *)&gtest_ar__4.message_);
  std::forward_list<int,_std::allocator<int>_>::~forward_list
            ((forward_list<int,_std::allocator<int>_> *)&gtest_ar__4.message_);
  local_2a1 = jessilib::object::has<std::forward_list<int,std::allocator<int>>>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_4.message_,local_2a0,
               "obj .has< std::forward_list<int> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x232,pcVar2);
    testing::internal::AssertHelper::operator=(local_2b8,local_2b0);
    testing::internal::AssertHelper::~AssertHelper(local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  local_2f8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<int,_std::allocator<int>_>::forward_list
            ((forward_list<int,_std::allocator<int>_> *)&local_2f8);
  jessilib::object::
  get<std::forward_list<int,_std::allocator<int>_>,_std::forward_list<int,_std::allocator<int>_>,_nullptr>
            ((object *)local_2f0,(forward_list<int,_std::allocator<int>_> *)local_58);
  local_300._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<int,_std::allocator<int>_>::forward_list
            ((forward_list<int,_std::allocator<int>_> *)&local_300);
  testing::internal::EqHelper::
  Compare<std::forward_list<int,_std::allocator<int>_>,_std::forward_list<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_2e8,"obj .get< std::forward_list<int> >()",
             "std::forward_list<int> {}",(forward_list<int,_std::allocator<int>_> *)local_2f0,
             (forward_list<int,_std::allocator<int>_> *)&local_300);
  std::forward_list<int,_std::allocator<int>_>::~forward_list
            ((forward_list<int,_std::allocator<int>_> *)&local_300);
  std::forward_list<int,_std::allocator<int>_>::~forward_list
            ((forward_list<int,_std::allocator<int>_> *)local_2f0);
  std::forward_list<int,_std::allocator<int>_>::~forward_list
            ((forward_list<int,_std::allocator<int>_> *)&local_2f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(local_308);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              (local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x232,pcVar2);
    testing::internal::AssertHelper::operator=(local_310,local_308);
    testing::internal::AssertHelper::~AssertHelper(local_310);
    testing::Message::~Message(local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<long,_std::allocator<long>_>::forward_list
            ((forward_list<long,_std::allocator<long>_> *)&gtest_ar__5.message_);
  jessilib::object::set<std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_58,(forward_list<long,_std::allocator<long>_> *)&gtest_ar__5.message_);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)&gtest_ar__5.message_);
  local_329 = jessilib::object::has<std::forward_list<long,std::allocator<long>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_328,&local_329,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(local_338);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_5.message_,local_328,
               "obj .has< std::forward_list<long> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_5.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x233,pcVar2);
    testing::internal::AssertHelper::operator=(local_340,local_338);
    testing::internal::AssertHelper::~AssertHelper(local_340);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  local_380._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long,_std::allocator<long>_>::forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_380);
  jessilib::object::
  get<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_378,(forward_list<long,_std::allocator<long>_> *)local_58);
  local_388._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long,_std::allocator<long>_>::forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_388);
  testing::internal::EqHelper::
  Compare<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((EqHelper *)local_370,"obj .get< std::forward_list<long> >()",
             "std::forward_list<long> {}",(forward_list<long,_std::allocator<long>_> *)local_378,
             (forward_list<long,_std::allocator<long>_> *)&local_388);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_388);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)local_378);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(local_390);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              (local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x233,pcVar2);
    testing::internal::AssertHelper::operator=(local_398,local_390);
    testing::internal::AssertHelper::~AssertHelper(local_398);
    testing::Message::~Message(local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<long_long,_std::allocator<long_long>_>::forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)&gtest_ar__6.message_);
  jessilib::object::set<std::forward_list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((object *)local_58,
             (forward_list<long_long,_std::allocator<long_long>_> *)&gtest_ar__6.message_);
  std::forward_list<long_long,_std::allocator<long_long>_>::~forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)&gtest_ar__6.message_);
  local_3b1 = jessilib::object::has<std::forward_list<long_long,std::allocator<long_long>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3b0,&local_3b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_6.message_,local_3b0,
               "obj .has< std::forward_list<long long> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_6.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x234,pcVar2);
    testing::internal::AssertHelper::operator=(local_3c8,local_3c0);
    testing::internal::AssertHelper::~AssertHelper(local_3c8);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  local_408._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long_long,_std::allocator<long_long>_>::forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)&local_408);
  jessilib::object::
  get<std::forward_list<long_long,_std::allocator<long_long>_>,_std::forward_list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((object *)local_400,(forward_list<long_long,_std::allocator<long_long>_> *)local_58);
  local_410._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long_long,_std::allocator<long_long>_>::forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)&local_410);
  testing::internal::EqHelper::
  Compare<std::forward_list<long_long,_std::allocator<long_long>_>,_std::forward_list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((EqHelper *)local_3f8,"obj .get< std::forward_list<long long> >()",
             "std::forward_list<long long> {}",
             (forward_list<long_long,_std::allocator<long_long>_> *)local_400,
             (forward_list<long_long,_std::allocator<long_long>_> *)&local_410);
  std::forward_list<long_long,_std::allocator<long_long>_>::~forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)&local_410);
  std::forward_list<long_long,_std::allocator<long_long>_>::~forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)local_400);
  std::forward_list<long_long,_std::allocator<long_long>_>::~forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)&local_408);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(local_418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              (local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x234,pcVar2);
    testing::internal::AssertHelper::operator=(local_420,local_418);
    testing::internal::AssertHelper::~AssertHelper(local_420);
    testing::Message::~Message(local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<long,_std::allocator<long>_>::forward_list
            ((forward_list<long,_std::allocator<long>_> *)&gtest_ar__7.message_);
  jessilib::object::set<std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_58,(forward_list<long,_std::allocator<long>_> *)&gtest_ar__7.message_);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)&gtest_ar__7.message_);
  local_439 = jessilib::object::has<std::forward_list<long,std::allocator<long>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_438,&local_439,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(local_448);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_7.message_,local_438,
               "obj .has< std::forward_list<intmax_t> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_7.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x235,pcVar2);
    testing::internal::AssertHelper::operator=(local_450,local_448);
    testing::internal::AssertHelper::~AssertHelper(local_450);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  local_490._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long,_std::allocator<long>_>::forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_490);
  jessilib::object::
  get<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_488,(forward_list<long,_std::allocator<long>_> *)local_58);
  local_498._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long,_std::allocator<long>_>::forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_498);
  testing::internal::EqHelper::
  Compare<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((EqHelper *)local_480,"obj .get< std::forward_list<intmax_t> >()",
             "std::forward_list<intmax_t> {}",(forward_list<long,_std::allocator<long>_> *)local_488
             ,(forward_list<long,_std::allocator<long>_> *)&local_498);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_498);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)local_488);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar1) {
    testing::Message::Message(local_4a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              (local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x235,pcVar2);
    testing::internal::AssertHelper::operator=(local_4a8,local_4a0);
    testing::internal::AssertHelper::~AssertHelper(local_4a8);
    testing::Message::~Message(local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<float,_std::allocator<float>_>::forward_list
            ((forward_list<float,_std::allocator<float>_> *)&gtest_ar__8.message_);
  jessilib::object::set<std::forward_list<float,_std::allocator<float>_>,_nullptr>
            ((object *)local_58,(forward_list<float,_std::allocator<float>_> *)&gtest_ar__8.message_
            );
  std::forward_list<float,_std::allocator<float>_>::~forward_list
            ((forward_list<float,_std::allocator<float>_> *)&gtest_ar__8.message_);
  local_4c1 = jessilib::object::has<std::forward_list<float,std::allocator<float>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c0,&local_4c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(local_4d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_8.message_,local_4c0,
               "obj .has< std::forward_list<float> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_8.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x236,pcVar2);
    testing::internal::AssertHelper::operator=(local_4d8,local_4d0);
    testing::internal::AssertHelper::~AssertHelper(local_4d8);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  local_518._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<float,_std::allocator<float>_>::forward_list
            ((forward_list<float,_std::allocator<float>_> *)&local_518);
  jessilib::object::
  get<std::forward_list<float,_std::allocator<float>_>,_std::forward_list<float,_std::allocator<float>_>,_nullptr>
            ((object *)local_510,(forward_list<float,_std::allocator<float>_> *)local_58);
  local_520._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<float,_std::allocator<float>_>::forward_list
            ((forward_list<float,_std::allocator<float>_> *)&local_520);
  testing::internal::EqHelper::
  Compare<std::forward_list<float,_std::allocator<float>_>,_std::forward_list<float,_std::allocator<float>_>,_nullptr>
            ((EqHelper *)local_508,"obj .get< std::forward_list<float> >()",
             "std::forward_list<float> {}",(forward_list<float,_std::allocator<float>_> *)local_510,
             (forward_list<float,_std::allocator<float>_> *)&local_520);
  std::forward_list<float,_std::allocator<float>_>::~forward_list
            ((forward_list<float,_std::allocator<float>_> *)&local_520);
  std::forward_list<float,_std::allocator<float>_>::~forward_list
            ((forward_list<float,_std::allocator<float>_> *)local_510);
  std::forward_list<float,_std::allocator<float>_>::~forward_list
            ((forward_list<float,_std::allocator<float>_> *)&local_518);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    testing::Message::Message(local_528);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
    testing::internal::AssertHelper::AssertHelper
              (local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x236,pcVar2);
    testing::internal::AssertHelper::operator=(local_530,local_528);
    testing::internal::AssertHelper::~AssertHelper(local_530);
    testing::Message::~Message(local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  gtest_ar__9.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<double,_std::allocator<double>_>::forward_list
            ((forward_list<double,_std::allocator<double>_> *)&gtest_ar__9.message_);
  jessilib::object::set<std::forward_list<double,_std::allocator<double>_>,_nullptr>
            ((object *)local_58,
             (forward_list<double,_std::allocator<double>_> *)&gtest_ar__9.message_);
  std::forward_list<double,_std::allocator<double>_>::~forward_list
            ((forward_list<double,_std::allocator<double>_> *)&gtest_ar__9.message_);
  local_549 = jessilib::object::has<std::forward_list<double,std::allocator<double>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_548,&local_549,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(local_558);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_9.message_,local_548,
               "obj .has< std::forward_list<double> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_9.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x237,pcVar2);
    testing::internal::AssertHelper::operator=(local_560,local_558);
    testing::internal::AssertHelper::~AssertHelper(local_560);
    std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
    testing::Message::~Message(local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  local_5a0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<double,_std::allocator<double>_>::forward_list
            ((forward_list<double,_std::allocator<double>_> *)&local_5a0);
  jessilib::object::
  get<std::forward_list<double,_std::allocator<double>_>,_std::forward_list<double,_std::allocator<double>_>,_nullptr>
            ((object *)local_598,(forward_list<double,_std::allocator<double>_> *)local_58);
  local_5a8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<double,_std::allocator<double>_>::forward_list
            ((forward_list<double,_std::allocator<double>_> *)&local_5a8);
  testing::internal::EqHelper::
  Compare<std::forward_list<double,_std::allocator<double>_>,_std::forward_list<double,_std::allocator<double>_>,_nullptr>
            ((EqHelper *)local_590,"obj .get< std::forward_list<double> >()",
             "std::forward_list<double> {}",
             (forward_list<double,_std::allocator<double>_> *)local_598,
             (forward_list<double,_std::allocator<double>_> *)&local_5a8);
  std::forward_list<double,_std::allocator<double>_>::~forward_list
            ((forward_list<double,_std::allocator<double>_> *)&local_5a8);
  std::forward_list<double,_std::allocator<double>_>::~forward_list
            ((forward_list<double,_std::allocator<double>_> *)local_598);
  std::forward_list<double,_std::allocator<double>_>::~forward_list
            ((forward_list<double,_std::allocator<double>_> *)&local_5a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(local_5b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_590);
    testing::internal::AssertHelper::AssertHelper
              (local_5b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x237,pcVar2);
    testing::internal::AssertHelper::operator=(local_5b8,local_5b0);
    testing::internal::AssertHelper::~AssertHelper(local_5b8);
    testing::Message::~Message(local_5b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  gtest_ar__10.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<long_double,_std::allocator<long_double>_>::forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)&gtest_ar__10.message_);
  jessilib::object::set<std::forward_list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((object *)local_58,
             (forward_list<long_double,_std::allocator<long_double>_> *)&gtest_ar__10.message_);
  std::forward_list<long_double,_std::allocator<long_double>_>::~forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)&gtest_ar__10.message_);
  local_5d1 = jessilib::object::has<std::forward_list<long_double,std::allocator<long_double>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5d0,&local_5d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(local_5e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_10.message_,local_5d0,
               "obj .has< std::forward_list<long double> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_10.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x238,pcVar2);
    testing::internal::AssertHelper::operator=(local_5e8,local_5e0);
    testing::internal::AssertHelper::~AssertHelper(local_5e8);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  local_628._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long_double,_std::allocator<long_double>_>::forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)&local_628);
  jessilib::object::
  get<std::forward_list<long_double,_std::allocator<long_double>_>,_std::forward_list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((object *)local_620,(forward_list<long_double,_std::allocator<long_double>_> *)local_58
            );
  local_630._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long_double,_std::allocator<long_double>_>::forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)&local_630);
  testing::internal::EqHelper::
  Compare<std::forward_list<long_double,_std::allocator<long_double>_>,_std::forward_list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((EqHelper *)local_618,"obj .get< std::forward_list<long double> >()",
             "std::forward_list<long double> {}",
             (forward_list<long_double,_std::allocator<long_double>_> *)local_620,
             (forward_list<long_double,_std::allocator<long_double>_> *)&local_630);
  std::forward_list<long_double,_std::allocator<long_double>_>::~forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)&local_630);
  std::forward_list<long_double,_std::allocator<long_double>_>::~forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)local_620);
  std::forward_list<long_double,_std::allocator<long_double>_>::~forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)&local_628);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar1) {
    testing::Message::Message(local_638);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
    testing::internal::AssertHelper::AssertHelper
              (local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x238,pcVar2);
    testing::internal::AssertHelper::operator=(local_640,local_638);
    testing::internal::AssertHelper::~AssertHelper(local_640);
    testing::Message::~Message(local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  gtest_ar__11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                  *)&gtest_ar__11.message_);
  jessilib::object::
  set<std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((object *)local_58,
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&gtest_ar__11.message_);
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                   *)&gtest_ar__11.message_);
  local_659 = jessilib::object::
              has<std::forward_list<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_658,&local_659,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
  if (!bVar1) {
    testing::Message::Message(local_668);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_11.message_,local_658,
               "obj .has< std::forward_list<std::u8string> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_11.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_670,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x239,pcVar2);
    testing::internal::AssertHelper::operator=(local_670,local_668);
    testing::internal::AssertHelper::~AssertHelper(local_670);
    std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
    testing::Message::~Message(local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
  local_6b0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                  *)&local_6b0);
  jessilib::object::
  get<std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((object *)local_6a8,
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_58);
  local_6b8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                  *)&local_6b8);
  testing::internal::EqHelper::
  Compare<std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((EqHelper *)local_6a0,"obj .get< std::forward_list<std::u8string> >()",
             "std::forward_list<std::u8string> {}",
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_6a8,
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_6b8);
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                   *)&local_6b8);
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                   *)local_6a8);
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                   *)&local_6b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a0);
  if (!bVar1) {
    testing::Message::Message(local_6c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a0);
    testing::internal::AssertHelper::AssertHelper
              (local_6c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x239,pcVar2);
    testing::internal::AssertHelper::operator=(local_6c8,local_6c0);
    testing::internal::AssertHelper::~AssertHelper(local_6c8);
    testing::Message::~Message(local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a0);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)
             &gtest_ar__12.message_);
  jessilib::object::
  set<std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)local_58,
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)
             &gtest_ar__12.message_);
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::~forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)
             &gtest_ar__12.message_);
  local_6e1 = jessilib::object::
              has<std::forward_list<jessilib::object,std::allocator<jessilib::object>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6e0,&local_6e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(local_6f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_12.message_,local_6e0,
               "obj .has< std::forward_list<object> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_12.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_6f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x23a,pcVar2);
    testing::internal::AssertHelper::operator=(local_6f8,local_6f0);
    testing::internal::AssertHelper::~AssertHelper(local_6f8);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(local_6f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  local_738._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_738);
  jessilib::object::
  get<std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)local_730,
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)local_58);
  local_740._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_740);
  testing::internal::EqHelper::
  Compare<std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((EqHelper *)local_728,"obj .get< std::forward_list<object> >()",
             "std::forward_list<object> {}",
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)local_730,
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_740);
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::~forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_740);
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::~forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)local_730);
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::~forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_738);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_728);
  if (!bVar1) {
    testing::Message::Message(local_748);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_728);
    testing::internal::AssertHelper::AssertHelper
              (local_750,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x23a,pcVar2);
    testing::internal::AssertHelper::operator=(local_750,local_748);
    testing::internal::AssertHelper::~AssertHelper(local_750);
    testing::Message::~Message(local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_728);
  jessilib::object::~object((object *)local_58);
  return;
}

Assistant:

TEST(ObjectTest, basic_set_forward_list) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, std::forward_list<bool>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<signed char>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<unsigned char>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<short>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<int>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<long>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<long long>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<intmax_t>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<float>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<double>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<long double>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<std::u8string>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<object>);
}